

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrSat.c
# Opt level: O2

void Pdr_ManSetPropertyOutput(Pdr_Man_t *p,int k)

{
  Vec_Int_t *p_00;
  int iVar1;
  undefined8 in_RAX;
  sat_solver *s;
  Aig_Obj_t *pObj;
  void *pvVar2;
  int i;
  undefined4 uStack_38;
  int Lit;
  
  if (p->pPars->fUsePropOut != 0) {
    _uStack_38 = in_RAX;
    s = Pdr_ManSolver(p,k);
    for (i = 0; i < p->pAig->nTruePos; i = i + 1) {
      pObj = (Aig_Obj_t *)Vec_PtrEntry(p->pAig->vCos,i);
      if (p->vCexes == (Vec_Ptr_t *)0x0) {
LAB_004e2cf8:
        p_00 = p->pPars->vOutMap;
        if (p_00 != (Vec_Int_t *)0x0) {
          iVar1 = Vec_IntEntry(p_00,i);
          if (iVar1 == -1) goto LAB_004e2d48;
        }
        iVar1 = Pdr_ObjSatVar(p,k,1,pObj);
        iVar1 = Abc_Var2Lit(iVar1,1);
        _uStack_38 = CONCAT44(iVar1,uStack_38);
        iVar1 = sat_solver_addclause(s,&Lit,(lit *)&stack0xffffffffffffffd0);
        if (iVar1 != 1) {
          __assert_fail("RetValue == 1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/pdr/pdrSat.c"
                        ,0xc5,"void Pdr_ManSetPropertyOutput(Pdr_Man_t *, int)");
        }
      }
      else {
        pvVar2 = Vec_PtrEntry(p->vCexes,i);
        if (pvVar2 == (void *)0x0) goto LAB_004e2cf8;
      }
LAB_004e2d48:
    }
    sat_solver_compress(s);
  }
  return;
}

Assistant:

void Pdr_ManSetPropertyOutput( Pdr_Man_t * p, int k )
{
    sat_solver * pSat;
    Aig_Obj_t * pObj;
    int Lit, RetValue, i;
    if ( !p->pPars->fUsePropOut )
        return;
    pSat = Pdr_ManSolver(p, k);
    Saig_ManForEachPo( p->pAig, pObj, i )
    {
        // skip solved outputs
        if ( p->vCexes && Vec_PtrEntry(p->vCexes, i) )
            continue;
        // skip timedout outputs
        if ( p->pPars->vOutMap && Vec_IntEntry(p->pPars->vOutMap, i) == -1 )
            continue;
        Lit = Abc_Var2Lit( Pdr_ObjSatVar(p, k, 1, pObj), 1 ); // neg literal
        RetValue = sat_solver_addclause( pSat, &Lit, &Lit + 1 );
        assert( RetValue == 1 );
    }
    sat_solver_compress( pSat );
}